

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.cc
# Opt level: O0

map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *
lrit::getHeaderMap(Buffer *b)

{
  value_type vVar1;
  uint uVar2;
  byte *pbVar3;
  runtime_error *prVar4;
  const_reference pvVar5;
  uint *puVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *in_RDI;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> m;
  int *in_stack_000000a0;
  char (*in_stack_000000a8) [2];
  char (*in_stack_000000b0) [90];
  char (*in_stack_000000b8) [42];
  uint32_t pos;
  uint32_t totalHeaderLength;
  uint16_t headerLength;
  uint8_t headerType;
  undefined4 in_stack_ffffffffffffff08;
  uint in_stack_ffffffffffffff0c;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff4c;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_ffffffffffffff50;
  string local_78 [35];
  undefined1 local_55;
  undefined4 local_44;
  string local_40 [36];
  uint local_1c;
  uint local_18;
  ushort local_14;
  byte local_11;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_10;
  
  local_1c = 0;
  local_10 = in_RSI;
  pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_RSI,0);
  local_11 = *pbVar3;
  if (local_11 != 0) {
    local_55 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_44 = 0x53;
    util::str<char[39],char[90],char[2],int>
              ((char (*) [39])in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,
               in_stack_000000a0);
    std::runtime_error::runtime_error(prVar4,local_40);
    local_55 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_10,1);
  vVar1 = *pvVar5;
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_10,2);
  local_14 = CONCAT11(vVar1,*pvVar5);
  if (local_14 != 0x10) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    util::str<char[42],char[90],char[2],int>
              (in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,in_stack_000000a0);
    std::runtime_error::runtime_error(prVar4,local_78);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar6 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (local_10,4);
  uVar2 = *puVar6;
  local_18 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x116fe9)
  ;
  do {
    if (local_18 <= local_1c) {
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
                (in_stack_ffffffffffffff10,
                 (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
LAB_0011712f:
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 0x117139);
      return in_RDI;
    }
    pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (local_10,(ulong)local_1c);
    local_11 = *pbVar3;
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (local_10,(ulong)(local_1c + 1));
    vVar1 = *pvVar5;
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (local_10,(ulong)(local_1c + 2));
    local_14 = CONCAT11(vVar1,*pvVar5);
    if (local_14 == 0) {
      memset(in_RDI,0,0x30);
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 0x117098);
      goto LAB_0011712f;
    }
    in_stack_ffffffffffffff0c = local_1c;
    in_stack_ffffffffffffff10 =
         (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
         std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::operator[]
                   (in_stack_ffffffffffffff50,
                    (key_type *)CONCAT44(in_stack_ffffffffffffff4c,(uint)local_11));
    *(uint *)&(in_stack_ffffffffffffff10->_M_t)._M_impl = in_stack_ffffffffffffff0c;
    local_1c = local_14 + local_1c;
  } while( true );
}

Assistant:

std::map<int, int> getHeaderMap(const Buffer& b) {
  uint8_t headerType;
  uint16_t headerLength;
  uint32_t totalHeaderLength;
  uint32_t pos = 0;

  headerType = b[0];
  ASSERT(headerType == 0);
  headerLength = (b[1] << 8) | b[2];
  ASSERT(headerLength == 16);
  memcpy(&totalHeaderLength, &b[4], 4);
  totalHeaderLength = __builtin_bswap32(totalHeaderLength);

  // Find LRIT headers
  std::map<int, int> m;
  while (pos < totalHeaderLength) {
    headerType = b[pos];
    headerLength = (b[pos+1] << 8) | b[pos+2];

    // Abort in case of invalid header length
    if (headerLength == 0) {
      return std::map<int, int>();
    }

    m[headerType] = pos;
    pos += headerLength;
  }

  return m;
}